

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

void PDHG_dualGradientStep
               (CUPDLPwork *work,CUPDLPvec *yUpdate,CUPDLPvec *y,CUPDLPvec *Ax,CUPDLPvec *AxUpdate,
               cupdlp_float dDualStepSize)

{
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  CUPDLPwork *in_XMM0_Qa;
  cupdlp_float alpha;
  CUPDLPproblem *problem;
  undefined4 in_stack_ffffffffffffffb8;
  cupdlp_int in_stack_ffffffffffffffbc;
  long lVar1;
  cupdlp_int n;
  
  lVar1 = *in_RDI;
  memcpy(*(void **)(in_RSI + 8),*(void **)(in_RDX + 8),(long)*(int *)(lVar1 + 0x40) << 3);
  n = (cupdlp_int)((ulong)lVar1 >> 0x20);
  cupdlp_axpy(in_XMM0_Qa,n,(cupdlp_float *)in_XMM0_Qa,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
              (cupdlp_float *)0x801499);
  cupdlp_axpy(in_XMM0_Qa,n,(cupdlp_float *)((double)in_XMM0_Qa * -2.0),
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
              (cupdlp_float *)0x8014d6);
  cupdlp_axpy(in_XMM0_Qa,n,(cupdlp_float *)in_XMM0_Qa,
              (cupdlp_float *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
              (cupdlp_float *)0x80150b);
  cupdlp_projPos((cupdlp_float *)in_XMM0_Qa,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void PDHG_dualGradientStep(CUPDLPwork *work, CUPDLPvec *yUpdate,
                           const CUPDLPvec *y, const CUPDLPvec *Ax,
                           const CUPDLPvec *AxUpdate, cupdlp_float dDualStepSize) {
  CUPDLPproblem *problem = work->problem;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_dgrad_cuda(yUpdate->data, y->data, problem->rhs, Ax->data,
                    AxUpdate->data, dDualStepSize, (int)problem->nRows,
                    (int)problem->nEqs);
#else
  // cupdlp_copy(yUpdate, y, cupdlp_float, problem->nRows);
  CUPDLP_COPY_VEC(yUpdate->data, y->data, cupdlp_float, problem->nRows);

  // AddToVector(yUpdate, dDualStepSize, problem->rhs, problem->nRows);
  // AddToVector(yUpdate, -2.0 * dDualStepSize, AxUpdate, problem->nRows);
  // AddToVector(yUpdate, dDualStepSize, Ax, problem->nRows);

  cupdlp_float alpha = dDualStepSize;
  cupdlp_axpy(work, problem->nRows, &alpha, problem->rhs, yUpdate->data);
  alpha = -2.0 * dDualStepSize;
  cupdlp_axpy(work, problem->nRows, &alpha, AxUpdate->data, yUpdate->data);
  alpha = dDualStepSize;
  cupdlp_axpy(work, problem->nRows, &alpha, Ax->data, yUpdate->data);

  cupdlp_projPos(yUpdate->data + problem->nEqs, problem->nRows - problem->nEqs);
#endif
}